

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O3

c_int update_linsys_solver_matrices_pardiso(pardiso_solver *s,csc *P,csc *A)

{
  update_KKT_P(s->KKT,P,s->PtoKKT,s->sigma,s->Pdiag_idx,s->Pdiag_n);
  update_KKT_A(s->KKT,A,s->AtoKKT);
  s->phase = 0x16;
  pardiso(s->pt,&s->maxfct,&s->mnum,&s->mtype,&s->phase,&s->nKKT,s->KKT->x,s->KKT_p,s->KKT_i,
          &s->idum,&s->nrhs,s->iparm,&s->msglvl,&s->fdum,&s->fdum,&s->error);
  return s->error;
}

Assistant:

c_int update_linsys_solver_matrices_pardiso(pardiso_solver * s, const csc *P, const csc *A) {

    // Update KKT matrix with new P
    update_KKT_P(s->KKT, P, s->PtoKKT, s->sigma, s->Pdiag_idx, s->Pdiag_n);

    // Update KKT matrix with new A
    update_KKT_A(s->KKT, A, s->AtoKKT);

    // Perform numerical factorization
    s->phase = PARDISO_NUMERIC;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));

    // Return exit flag
    return s->error;
}